

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

void fft2d(float *data,long M2,long M)

{
  float *data_00;
  long Rows;
  long in_RDX;
  long in_RSI;
  xdouble *in_RDI;
  long unaff_retaddr;
  xdouble *in_stack_00000008;
  long i1;
  long in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  float *in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffe0;
  ulong Ncols;
  
  if ((in_RSI < 1) || (in_RDX < 1)) {
    ffts(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    ffts(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (in_RDX < 3) {
      Rows = 1L << ((byte)in_RSI & 0x3f);
      dxpose(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      ffts(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,Rows);
      dxpose(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    }
    else {
      for (Ncols = 0; Ncols < (ulong)(1L << ((byte)in_RDX & 0x3f)); Ncols = Ncols + 4) {
        data_00 = (float *)(1L << ((byte)in_RSI & 0x3f));
        dxpose(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,Ncols);
        ffts(data_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        dxpose(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,Ncols);
      }
    }
  }
  return;
}

Assistant:

void fft2d(float *data, long M2, long M){
/* Compute 2D complex fft and return results in-place	*/
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows */
/* M = log2 of fft size number of columns */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	ffts(data, M, POW2(M2));
	if (M>2)
		for (i1=0; i1<POW2(M); i1+=4){
			cxpose(data + i1*2, POW2(M), Array2d[M2], POW2(M2), POW2(M2), 4);
			ffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M), 4, POW2(M2));
		}
	else{
		cxpose(data, POW2(M), Array2d[M2], POW2(M2), POW2(M2), POW2(M));
		ffts(Array2d[M2], M2, POW2(M));
		cxpose(Array2d[M2], POW2(M2), data, POW2(M), POW2(M), POW2(M2));
	}
}
else
	ffts(data, M2+M, 1);
}